

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O1

reference __thiscall
jsoncons::jsonpath::detail::
index_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::evaluate(index_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
           *this,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 *context,reference root,path_node_type *last,reference current,
          result_options options,error_code *ec)

{
  size_t i_00;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar4;
  undefined4 extraout_var;
  reference pbVar5;
  size_t i;
  supertype *psVar6;
  _func_int **pp_Var7;
  size_t i_1;
  size_t local_50;
  reference local_48;
  error_code *local_40;
  path_node_type *local_38;
  
  local_40 = ec;
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array(current);
  if (bVar1) {
    local_48 = root;
    sVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(current);
    i_00 = this->index_;
    if ((long)i_00 < (long)sVar3 && -1 < (long)i_00) {
      local_50 = i_00;
      if ((options & (path|sort|nodups)) != value) {
        local_38 = last;
        last = eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
               ::create_path_node<jsoncons::jsonpath::basic_path_node<char>const*,unsigned_long&>
                         ((eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
                           *)context,&local_38,&local_50);
      }
      pbVar4 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at(current,i_00);
      psVar6 = (this->
               super_base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
               ).tail_;
      if (psVar6 == (supertype *)0x0) {
        return pbVar4;
      }
      pp_Var7 = psVar6->_vptr_jsonpath_selector;
    }
    else {
      sVar3 = sVar3 + i_00;
      if (-1 < (long)i_00 || (long)sVar3 < 0) goto LAB_003e6255;
      local_50 = sVar3;
      if ((options & (path|sort|nodups)) != value) {
        local_38 = last;
        last = eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
               ::create_path_node<jsoncons::jsonpath::basic_path_node<char>const*,unsigned_long&>
                         ((eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
                           *)context,&local_38,&local_50);
      }
      pbVar4 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at(current,sVar3);
      psVar6 = (this->
               super_base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
               ).tail_;
      if (psVar6 == (supertype *)0x0) {
        return pbVar4;
      }
      pp_Var7 = psVar6->_vptr_jsonpath_selector;
    }
    iVar2 = (*pp_Var7[3])(psVar6,context,local_48,last,pbVar4,(ulong)options,local_40);
    return (reference)CONCAT44(extraout_var,iVar2);
  }
LAB_003e6255:
  pbVar5 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
           ::null_value(context);
  return pbVar5;
}

Assistant:

reference evaluate(eval_context<Json,JsonReference>& context,
                           reference root,
                           const path_node_type& last, 
                           reference current, 
                           result_options options,
                           std::error_code& ec) const override
        {
            if (current.is_array())
            {
                auto slen = static_cast<int64_t>(current.size());
                if (index_ >= 0 && index_ < slen)
                {
                    auto i = static_cast<std::size_t>(index_);
                    return this->evaluate_tail(context, root, 
                                        path_generator_type::generate(context, last, i, options), 
                                        current.at(i), options, ec);
                }
                int64_t index = slen + index_;
                if (index >= 0 && index < slen)
                {
                    auto i = static_cast<std::size_t>(index);
                    return this->evaluate_tail(context, root, 
                                        path_generator_type::generate(context, last, i, options), 
                                        current.at(i), options, ec);
                }
                return context.null_value();
            }
            return context.null_value();
        }